

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void StopRPC(any *context)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *in_FS_OFFSET;
  any *local_28;
  undefined1 *local_20;
  long local_18;
  
  local_20 = (undefined1 *)&local_28;
  local_18 = in_FS_OFFSET[5];
  if (((byte)g_rpc_running._M_base._M_i & 1) != 0) {
    __assert_fail("!g_rpc_running",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/server.cpp"
                  ,0x12d,"void StopRPC(const std::any &)");
  }
  plVar1 = (long *)*in_FS_OFFSET;
  *plVar1 = (long)&local_20;
  puVar2 = (undefined8 *)*in_FS_OFFSET;
  *puVar2 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  local_28 = context;
  iVar3 = pthread_once(&StopRPC::g_rpc_stop_flag._M_once,__once_proxy);
  if (iVar3 == 0) {
    *plVar1 = 0;
    *puVar2 = 0;
    if (in_FS_OFFSET[5] == local_18) {
      return;
    }
  }
  else if (in_FS_OFFSET[5] == local_18) {
    uVar4 = std::__throw_system_error(iVar3);
    *plVar1 = 0;
    *puVar2 = 0;
    if (in_FS_OFFSET[5] == local_18) {
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

void StopRPC(const std::any& context)
{
    static std::once_flag g_rpc_stop_flag;
    // This function could be called twice if the GUI has been started with -server=1.
    assert(!g_rpc_running);
    std::call_once(g_rpc_stop_flag, [&]() {
        LogDebug(BCLog::RPC, "Stopping RPC\n");
        WITH_LOCK(g_deadline_timers_mutex, deadlineTimers.clear());
        DeleteAuthCookie();
        node::NodeContext& node = EnsureAnyNodeContext(context);
        // The notifications interface doesn't exist between initialization step 4a and 7.
        if (node.notifications) node.notifications->m_tip_block_cv.notify_all();
        LogDebug(BCLog::RPC, "RPC stopped.\n");
    });
}